

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void __thiscall
Lib::
SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
::~SkipList(SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
            *this)

{
  makeEmpty(this);
  Lib::free(this->_left);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }